

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion.hpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
ranges::detail::to_container::fn<meta::id<std::vector<double,std::allocator<double>>>>::
impl<std::vector<double,std::allocator<double>>,ranges::basic_iterator<ranges::join_view<ranges::ref_view<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>>::cursor<true>>,ranges::join_view<ranges::ref_view<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>>>
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__)

{
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<double,std::allocator<double>>::
  _M_range_initialize<ranges::basic_iterator<ranges::join_view<ranges::ref_view<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>>::cursor<true>>>
            ();
  return __return_storage_ptr__;
}

Assistant:

static Cont impl(Rng && rng, std::false_type)
            {
                return Cont(I{ranges::begin(rng)}, I{ranges::end(rng)});
            }